

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_marker_header(j_compress_ptr cinfo,int marker,uint datalen)

{
  uint datalen_local;
  int marker_local;
  j_compress_ptr cinfo_local;
  
  if (0xfffd < datalen) {
    cinfo->err->msg_code = 0xc;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  emit_marker(cinfo,marker);
  emit_2bytes(cinfo,datalen + 2);
  return;
}

Assistant:

METHODDEF(void)
write_marker_header (j_compress_ptr cinfo, int marker, unsigned int datalen)
/* Emit an arbitrary marker header */
{
  if (datalen > (unsigned int) 65533)		/* safety check */
    ERREXIT(cinfo, JERR_BAD_LENGTH);

  emit_marker(cinfo, (JPEG_MARKER) marker);

  emit_2bytes(cinfo, (int) (datalen + 2));	/* total length */
}